

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O0

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapePrism>::ComputeSolutionKernelHdivT<double>
          (TPZCompElKernelHDiv3D<pzshape::TPZShapePrism> *this,TPZMaterialDataT<double> *data)

{
  int iVar1;
  undefined4 extraout_var;
  TPZCompMesh *this_00;
  TPZFMatrix<double> *this_01;
  int64_t iVar2;
  TPZManVector<double,_10> *pTVar3;
  TPZFNMatrix<30,_double> *pTVar4;
  long in_RSI;
  TPZSolutionMatrix *in_RDI;
  TPZVec<double> *unaff_retaddr;
  int64_t is;
  int64_t numbersol;
  TPZFMatrix<double> *MeshSol;
  int ncon;
  int nstate;
  int dim;
  TPZFMatrix<double> *in_stack_00000058;
  TPZCompElHCurl<pzshape::TPZShapePrism> *in_stack_00000060;
  TPZManVector<TPZManVector<double,_10>,_20> *in_stack_00000068;
  TPZManVector<TPZManVector<double,_10>,_20> *in_stack_00000070;
  int64_t in_stack_00000078;
  TPZManVector<TPZFNMatrix<30,_double>,_20> *in_stack_00000080;
  TPZCompEl *in_stack_00000190;
  size_t in_stack_000003c8;
  char *in_stack_000003d0;
  int64_t local_38;
  undefined4 uVar5;
  TPZSolutionMatrix *copy;
  
  copy = in_RDI;
  TPZCompElHCurl<pzshape::TPZShapePrism>::ComputeSolutionHCurlT<double>
            (in_stack_00000060,in_stack_00000058,(TPZFMatrix<double> *)this,
             (TPZSolVec<double> *)data,_nstate);
  uVar5 = 3;
  iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x17])();
  iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x78))();
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x12])();
  this_00 = TPZCompEl::Mesh(in_stack_00000190);
  TPZCompMesh::Solution(this_00);
  this_01 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_RDI);
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)this_01);
  if (iVar2 != 1) {
    pzinternal::DebugStopImpl(in_stack_000003d0,in_stack_000003c8);
  }
  TPZManVector<TPZManVector<double,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<double,_10>,_20> *)in_stack_00000080,in_stack_00000078);
  TPZManVector<TPZFNMatrix<30,_double>,_20>::Resize(in_stack_00000080,in_stack_00000078);
  TPZManVector<TPZManVector<double,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<double,_10>,_20> *)in_stack_00000080,in_stack_00000078);
  for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
    pTVar3 = TPZVec<TPZManVector<double,_10>_>::operator[]
                       ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x48d0),local_38);
    (*(pTVar3->super_TPZVec<double>)._vptr_TPZVec[3])(pTVar3,(long)(iVar1 * 3));
    TPZVec<TPZManVector<double,_10>_>::operator[]
              ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x48d0),local_38);
    TPZVec<double>::Fill(unaff_retaddr,(double *)copy,in_RSI,CONCAT44(uVar5,iVar1));
    pTVar4 = TPZVec<TPZFNMatrix<30,_double>_>::operator[]
                       ((TPZVec<TPZFNMatrix<30,_double>_> *)(in_RSI + 0x51b0),local_38);
    (*(pTVar4->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])(pTVar4,(long)(iVar1 * 3),3);
    pTVar3 = TPZVec<TPZManVector<double,_10>_>::operator[]
                       ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x7070),local_38);
    (*(pTVar3->super_TPZVec<double>)._vptr_TPZVec[3])(pTVar3,(long)iVar1);
    TPZVec<TPZManVector<double,_10>_>::operator[]
              ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x7070),local_38);
    TPZVec<double>::Fill(unaff_retaddr,(double *)copy,in_RSI,CONCAT44(uVar5,iVar1));
  }
  TPZManVector<TPZManVector<double,_10>,_20>::operator=(in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeSolutionKernelHdivT(TPZMaterialDataT<TVar> &data)
{
    this->ComputeSolutionHCurlT(data.phi, data.curlphi,
                                data.sol, data.curlsol);

    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }
    data.sol = data.curlsol;

}